

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O2

void __thiscall
asio::
basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
::basic_io_object(basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                  *this,io_context *io_context)

{
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *pwVar1;
  
  pwVar1 = use_service<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                     (io_context);
  this->service_ = pwVar1;
  (this->implementation_).timer_data.op_queue_.front_ = (wait_op *)0x0;
  (this->implementation_).timer_data.op_queue_.back_ = (wait_op *)0x0;
  (this->implementation_).timer_data.heap_index_ = 0xffffffffffffffff;
  (this->implementation_).timer_data.next_ = (per_timer_data *)0x0;
  (this->implementation_).timer_data.prev_ = (per_timer_data *)0x0;
  (this->implementation_).expiry.__d.__r = 0;
  (this->implementation_).might_have_pending_waits = false;
  return;
}

Assistant:

explicit basic_io_object(asio::io_context& io_context)
    : service_(&asio::use_service<IoObjectService>(io_context))
  {
    service_->construct(implementation_);
  }